

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_resolver_error(Curl_easy *data)

{
  connectdata *conn;
  char *pcStack_18;
  CURLcode result;
  char *host_or_proxy;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->conn->bits).field_0x4 & 1) == 0) {
    pcStack_18 = "host";
    conn._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    pcStack_18 = "proxy";
    conn._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
  }
  Curl_failf(data,"Could not resolve %s: %s",pcStack_18,(data->state).async.hostname);
  return conn._4_4_;
}

Assistant:

CURLcode Curl_resolver_error(struct Curl_easy *data)
{
  const char *host_or_proxy;
  CURLcode result;

#ifndef CURL_DISABLE_PROXY
  struct connectdata *conn = data->conn;
  if(conn->bits.httpproxy) {
    host_or_proxy = "proxy";
    result = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else
#endif
  {
    host_or_proxy = "host";
    result = CURLE_COULDNT_RESOLVE_HOST;
  }

  failf(data, "Could not resolve %s: %s", host_or_proxy,
        data->state.async.hostname);

  return result;
}